

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O0

void __thiscall ipx::LpSolver::RunMainIPM(LpSolver *this,IPM *ipm)

{
  ipxint i;
  KKTSolverBasis *in_RSI;
  Control *in_RDI;
  HighsCallback *pHVar1;
  Timer timer;
  KKTSolverBasis kkt;
  unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_> *in_stack_fffffffffffffd70;
  Basis *in_stack_fffffffffffffdb0;
  Control *in_stack_fffffffffffffdb8;
  KKTSolverBasis *in_stack_fffffffffffffdc0;
  
  std::unique_ptr<ipx::Basis,_std::default_delete<ipx::Basis>_>::operator*
            (in_stack_fffffffffffffd70);
  KKTSolverBasis::KKTSolverBasis
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  Timer::Timer((Timer *)in_stack_fffffffffffffd70);
  i = Control::ipm_maxiter(in_RDI);
  IPM::maxiter((IPM *)in_RSI,i);
  std::unique_ptr<ipx::Iterate,_std::default_delete<ipx::Iterate>_>::get
            ((unique_ptr<ipx::Iterate,_std::default_delete<ipx::Iterate>_> *)in_RSI);
  IPM::Driver((IPM *)kkt.splitted_normal_matrix_.free_positions_.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start,
              (KKTSolver *)
              kkt.splitted_normal_matrix_.N_.values_queue_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,
              (Iterate *)
              kkt.splitted_normal_matrix_.N_.values_queue_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish,
              (Info *)kkt.splitted_normal_matrix_.N_.values_queue_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
  pHVar1 = (HighsCallback *)Timer::Elapsed((Timer *)in_RSI);
  in_RDI[1].callback_ = pHVar1;
  KKTSolverBasis::~KKTSolverBasis(in_RSI);
  return;
}

Assistant:

void LpSolver::RunMainIPM(IPM& ipm) {
    KKTSolverBasis kkt(control_, *basis_);
    Timer timer;
    ipm.maxiter(control_.ipm_maxiter());
    ipm.Driver(&kkt, iterate_.get(), &info_);
    info_.time_ipm2 = timer.Elapsed();
}